

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

exr_result_t
fasthuf_initialize(exr_const_context_t pctxt,FastHufDecoder *fhd,uint8_t **table,uint64_t numBytes,
                  uint32_t minSymbol,uint32_t maxSymbol,int rleSymbol)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t *base_00;
  long lVar4;
  long in_RCX;
  ulong *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  double dVar5;
  undefined1 auVar6 [16];
  uint64_t symbol_1;
  int i_4;
  int i_3;
  int i_2;
  int k;
  double tmp;
  int l_1;
  int l;
  double *countTmp;
  int i_1;
  uint64_t symbol;
  int i;
  uint64_t mapping [59];
  uint8_t *topByte;
  uint64_t codeLen;
  int currBitCount;
  uint64_t currBits;
  uint8_t *currByte;
  size_t codeCount [59];
  uint64_t offset [59];
  uint64_t base [59];
  ulong local_810;
  uint local_808;
  int local_804;
  uint local_800;
  uint local_7fc;
  double local_7f8;
  uint local_7f0;
  uint local_7ec;
  undefined4 in_stack_fffffffffffff820;
  int iVar7;
  undefined4 in_stack_fffffffffffff830;
  int iVar8;
  exr_const_context_t in_stack_fffffffffffff838;
  int local_5dc;
  uint64_t local_5d8;
  uint8_t *local_5d0;
  long alStack_5c8 [60];
  double local_3e8 [60];
  ulong local_208 [59];
  uint local_30;
  uint local_2c;
  ulong *local_20;
  undefined4 *local_18;
  long local_10;
  exr_result_t local_4;
  
  local_5d0 = (uint8_t *)*in_RDX;
  local_5d8 = 0;
  local_5dc = 0;
  uVar1 = *in_RDX;
  *in_RSI = (undefined4)symbol_1;
  in_RSI[1] = 0;
  *(undefined1 *)(in_RSI + 2) = 0xff;
  *(undefined1 *)((long)in_RSI + 9) = 0;
  for (iVar8 = 0; iVar8 < 0x3b; iVar8 = iVar8 + 1) {
    alStack_5c8[iVar8] = 0;
    local_208[iVar8] = 0xffffffffffffffff;
    local_3e8[iVar8] = 0.0;
  }
  base_00 = (uint64_t *)(ulong)in_R8D;
  local_30 = in_R9D;
  local_2c = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    if ((uint64_t *)(ulong)local_30 < base_00) {
      for (iVar7 = 0; iVar7 < 0x3a; iVar7 = iVar7 + 1) {
        local_18[1] = (int)alStack_5c8[iVar7] + local_18[1];
      }
      if ((uint)local_18[1] < 0x10002) {
        for (local_7ec = (uint)*(byte *)(local_18 + 2);
            (int)local_7ec <= (int)(uint)*(byte *)((long)local_18 + 9); local_7ec = local_7ec + 1) {
          lVar4 = alStack_5c8[(int)local_7ec];
          auVar6._8_4_ = (int)((ulong)lVar4 >> 0x20);
          auVar6._0_8_ = lVar4;
          auVar6._12_4_ = 0x45300000;
          local_3e8[(int)local_7ec] =
               ((auVar6._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) *
               (double)(2L << (*(char *)((long)local_18 + 9) - (char)local_7ec & 0x3fU));
        }
        for (local_7f0 = (uint)*(byte *)(local_18 + 2);
            (int)local_7f0 <= (int)(uint)*(byte *)((long)local_18 + 9); local_7f0 = local_7f0 + 1) {
          local_7f8 = 0.0;
          local_7fc = local_7f0;
          while (local_7fc = local_7fc + 1,
                (int)local_7fc <= (int)(uint)*(byte *)((long)local_18 + 9)) {
            local_7f8 = local_3e8[(int)local_7fc] + local_7f8;
          }
          dVar5 = ceil(local_7f8 /
                       (double)(2L << (*(char *)((long)local_18 + 9) - (char)local_7f0 & 0x3fU)));
          local_208[(int)local_7f0] =
               (long)dVar5 | (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f;
        }
        local_3e8[*(byte *)((long)local_18 + 9)] = 0.0;
        uVar2 = (uint)*(byte *)((long)local_18 + 9);
        while (local_800 = uVar2 - 1, (int)(uint)*(byte *)(local_18 + 2) <= (int)local_800) {
          local_3e8[(int)local_800] =
               (double)((long)local_3e8[(int)uVar2] + alStack_5c8[(int)uVar2]);
          uVar2 = local_800;
        }
        for (local_804 = 0; local_804 < 0x3b; local_804 = local_804 + 1) {
          *(undefined8 *)(&stack0xfffffffffffff838 + (long)local_804 * 8) = 0xffffffffffffffff;
        }
        for (local_808 = (uint)*(byte *)(local_18 + 2);
            (int)local_808 <= (int)(uint)*(byte *)((long)local_18 + 9); local_808 = local_808 + 1) {
          *(double *)(&stack0xfffffffffffff838 + (long)(int)local_808 * 8) =
               local_3e8[(int)local_808];
        }
        local_5d0 = (uint8_t *)*local_20;
        local_5d8 = 0;
        local_5dc = 0;
        for (local_810 = (ulong)local_2c; local_810 <= local_30; local_810 = local_810 + 1) {
          uVar3 = fasthuf_read_bits(6,&local_5d8,&local_5dc,&local_5d0);
          if (uVar3 < 0x3b) {
            if (uVar3 != 0) {
              if ((ulong)(uint)local_18[1] <= *(ulong *)(&stack0xfffffffffffff838 + uVar3 * 8)) {
                if (local_10 != 0) {
                  (**(code **)(local_10 + 0x48))
                            (local_10,0x17,"Huffman decode error (Invalid symbol in header)");
                }
                return 0x17;
              }
              local_18[*(long *)(&stack0xfffffffffffff838 + uVar3 * 8) + 3] = (int)local_810;
              *(long *)(&stack0xfffffffffffff838 + uVar3 * 8) =
                   *(long *)(&stack0xfffffffffffff838 + uVar3 * 8) + 1;
            }
          }
          else {
            if (uVar3 == 0x3f) {
              uVar3 = fasthuf_read_bits(8,&local_5d8,&local_5dc,&local_5d0);
              lVar4 = uVar3 + 5;
            }
            else {
              lVar4 = uVar3 - 0x3a;
            }
            local_810 = lVar4 + local_810;
          }
        }
        *local_20 = (ulong)local_5d0;
        local_4 = FastHufDecoder_buildTables
                            (in_stack_fffffffffffff838,
                             (FastHufDecoder *)CONCAT44(iVar8,in_stack_fffffffffffff830),base_00,
                             (uint64_t *)CONCAT44(iVar7,in_stack_fffffffffffff820));
      }
      else {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,"Error decoding Huffman table (Too many symbols).");
        }
        local_4 = 0x17;
      }
      return local_4;
    }
    if ((uint8_t *)(uVar1 + in_RCX) <= local_5d0) {
      if (local_10 != 0) {
        (**(code **)(local_10 + 0x48))
                  (local_10,0x17,"Error decoding Huffman table (Truncated table data).");
      }
      return 0x17;
    }
    uVar3 = fasthuf_read_bits(6,&local_5d8,&local_5dc,&local_5d0);
    if (uVar3 < 0x3b) {
      if (uVar3 != 0) {
        if (uVar3 < *(byte *)(local_18 + 2)) {
          *(char *)(local_18 + 2) = (char)uVar3;
        }
        if (*(byte *)((long)local_18 + 9) < uVar3) {
          *(char *)((long)local_18 + 9) = (char)uVar3;
        }
        alStack_5c8[uVar3] = alStack_5c8[uVar3] + 1;
        goto LAB_0023e744;
      }
    }
    else {
      if (uVar3 == 0x3f) {
        if ((uint8_t *)(uVar1 + in_RCX) <= local_5d0) {
          if (local_10 != 0) {
            (**(code **)(local_10 + 0x48))
                      (local_10,0x17,"Error decoding Huffman table (Truncated table data).");
          }
          return 0x17;
        }
        uVar3 = fasthuf_read_bits(8,&local_5d8,&local_5dc,&local_5d0);
        base_00 = (uint64_t *)(uVar3 + 5 + (long)base_00);
      }
      else {
        base_00 = (uint64_t *)((uVar3 - 0x3a) + (long)base_00);
      }
LAB_0023e744:
      if ((uint64_t *)(ulong)local_30 < base_00) {
        if (local_10 != 0) {
          (**(code **)(local_10 + 0x48))
                    (local_10,0x17,"Error decoding Huffman table (Run beyond end of table).");
        }
        return 0x17;
      }
    }
    base_00 = (uint64_t *)((long)base_00 + 1);
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_initialize (
    exr_const_context_t pctxt,
    FastHufDecoder*     fhd,
    const uint8_t**     table,
    uint64_t            numBytes,
    uint32_t            minSymbol,
    uint32_t            maxSymbol,
    int                 rleSymbol)
{
    //
    // The 'base' table is the minimum code at each code length. base[i]
    // is the smallest code (numerically) of length i.
    //

    uint64_t base[MAX_CODE_LEN + 1];

    //
    // The 'offset' table is the position (in sorted order) of the first id
    // of a given code length. Array is indexed by code length, like base.
    //

    uint64_t offset[MAX_CODE_LEN + 1];

    //
    // Count of how many codes at each length there are. Array is
    // indexed by code length, like base and offset.
    //

    size_t codeCount[MAX_CODE_LEN + 1];

    const uint8_t* currByte     = *table;
    uint64_t       currBits     = 0;
    int            currBitCount = 0;

    uint64_t       codeLen;
    const uint8_t* topByte = *table + numBytes;

    uint64_t mapping[MAX_CODE_LEN + 1];

    fhd->_rleSymbol     = rleSymbol;
    fhd->_numSymbols    = 0;
    fhd->_minCodeLength = 255;
    fhd->_maxCodeLength = 0;

    for (int i = 0; i <= MAX_CODE_LEN; ++i)
    {
        codeCount[i] = 0;
        base[i]      = 0xffffffffffffffffULL;
        offset[i]    = 0;
    }

    //
    // Count the number of codes, the min/max code lengths, the number of
    // codes with each length, and record symbols with non-zero code
    // length as we find them.
    //

    for (uint64_t symbol = (uint64_t) minSymbol; symbol <= (uint64_t) maxSymbol;
         symbol++)
    {
        if (currByte >= topByte)
        {
            if (pctxt)
                pctxt->print_error (
                    pctxt,
                    EXR_ERR_CORRUPT_CHUNK,
                    "Error decoding Huffman table (Truncated table data).");
            return EXR_ERR_CORRUPT_CHUNK;
        }

        //
        // Next code length - either:
        //       0-58  (literal code length)
        //       59-62 (various lengths runs of 0)
        //       63    (run of n 0's, with n is the next 8 bits)
        //

        codeLen = fasthuf_read_bits (6, &currBits, &currBitCount, &currByte);

        if (codeLen < (uint64_t) SHORT_ZEROCODE_RUN)
        {
            if (codeLen == 0) continue;

            if (codeLen < fhd->_minCodeLength)
                fhd->_minCodeLength = (uint8_t) codeLen;

            if (codeLen > fhd->_maxCodeLength)
                fhd->_maxCodeLength = (uint8_t) codeLen;

            codeCount[codeLen]++;
        }
        else if (codeLen == (uint64_t) LONG_ZEROCODE_RUN)
        {
            if (currByte >= topByte)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Error decoding Huffman table (Truncated table data).");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            symbol +=
                fasthuf_read_bits (8, &currBits, &currBitCount, &currByte) +
                SHORTEST_LONG_RUN - 1;
        }
        else
            symbol += codeLen - SHORT_ZEROCODE_RUN + 1;

        if (symbol > (uint64_t) maxSymbol)
        {
            if (pctxt)
                pctxt->print_error (
                    pctxt,
                    EXR_ERR_CORRUPT_CHUNK,
                    "Error decoding Huffman table (Run beyond end of table).");
            return EXR_ERR_CORRUPT_CHUNK;
        }
    }

    for (int i = 0; i < MAX_CODE_LEN; ++i)
        fhd->_numSymbols += (uint32_t) codeCount[i];

    if ((size_t) fhd->_numSymbols > sizeof (fhd->_idToSymbol) / sizeof (uint32_t))
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Error decoding Huffman table (Too many symbols).");
        return EXR_ERR_CORRUPT_CHUNK;
    }

    //
    // Compute base - once we have the code length counts, there
    //                is a closed form solution for this
    //

    {
        double* countTmp = (double*) offset; /* temp space */

        for (int l = fhd->_minCodeLength; l <= fhd->_maxCodeLength; ++l)
        {
            countTmp[l] = (double) codeCount[l] *
                          (double) (2ll << (fhd->_maxCodeLength - l));
        }

        for (int l = fhd->_minCodeLength; l <= fhd->_maxCodeLength; ++l)
        {
            double tmp = 0;

            for (int k = l + 1; k <= fhd->_maxCodeLength; ++k)
                tmp += countTmp[k];

            tmp /= (double) (2ll << (fhd->_maxCodeLength - l));

            base[l] = (uint64_t) (ceil (tmp));
        }
    }

    //
    // Compute offset - these are the positions of the first
    //                  id (not symbol) that has length [i]
    //

    offset[fhd->_maxCodeLength] = 0;

    for (int i = fhd->_maxCodeLength - 1; i >= fhd->_minCodeLength; i--)
        offset[i] = offset[i + 1] + codeCount[i + 1];

    //
    // Allocate and fill the symbol-to-id mapping. Smaller Ids should be
    // mapped to less-frequent symbols (which have longer codes). Use
    // the offset table to tell us where the id's for a given code
    // length start off.
    //

    for (int i = 0; i < MAX_CODE_LEN + 1; ++i)
        mapping[i] = (uint64_t) -1;
    for (int i = fhd->_minCodeLength; i <= fhd->_maxCodeLength; ++i)
        mapping[i] = offset[i];

    currByte     = *table;
    currBits     = 0;
    currBitCount = 0;

    //
    // Although we could have created an uncompressed list of symbols in our
    // decoding loop above, it's faster to decode the compressed data again
    //
    for (uint64_t symbol = (uint64_t) minSymbol; symbol <= (uint64_t) maxSymbol;
         symbol++)
    {
        codeLen = fasthuf_read_bits (6, &currBits, &currBitCount, &currByte);

        if (codeLen < (uint64_t) SHORT_ZEROCODE_RUN)
        {
            if (codeLen == 0) continue;

            if (mapping[codeLen] >= (uint64_t) fhd->_numSymbols)
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid symbol in header)");
                return EXR_ERR_CORRUPT_CHUNK;
            }
            fhd->_idToSymbol[mapping[codeLen]] = (uint32_t) symbol;
            mapping[codeLen]++;
        }
        else if (codeLen == (uint64_t) LONG_ZEROCODE_RUN)
            symbol +=
                fasthuf_read_bits (8, &currBits, &currBitCount, &currByte) +
                SHORTEST_LONG_RUN - 1;
        else
            symbol += codeLen - SHORT_ZEROCODE_RUN + 1;
    }

    *table = currByte;

    return FastHufDecoder_buildTables (pctxt, fhd, base, offset);
}